

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color *p_Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  _Rb_tree_color _Var6;
  _Rb_tree_color _Var7;
  _Rb_tree_color _Var8;
  int iVar9;
  pointer ppVar10;
  _Base_ptr p_Var11;
  FileMetaData *pFVar12;
  ulong uVar13;
  long lVar14;
  pointer ppVar15;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar16;
  uint64_t number;
  FileMetaData *local_50 [2];
  
  ppVar10 = (edit->compact_pointers_).
            super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((edit->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    lVar14 = 0x10;
    uVar13 = 0;
    do {
      lVar4 = *(long *)((long)&ppVar10->first + lVar14);
      if (lVar4 == 0) {
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                      ,0x94,"Slice leveldb::InternalKey::Encode() const");
      }
      iVar3 = *(int *)((long)ppVar10 + lVar14 + -0x10);
      lVar5 = *(long *)((long)ppVar10 + lVar14 + -8);
      local_50[0] = (FileMetaData *)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,lVar5,lVar4 + lVar5);
      std::__cxx11::string::operator=
                ((string *)(this->vset_->compact_pointer_ + iVar3),(string *)local_50);
      if (local_50[0] != (FileMetaData *)&stack0xffffffffffffffc0) {
        operator_delete(local_50[0]);
      }
      uVar13 = uVar13 + 1;
      ppVar10 = (edit->compact_pointers_).
                super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x28;
    } while (uVar13 < (ulong)(((long)(edit->compact_pointers_).
                                     super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 3
                              ) * -0x3333333333333333));
  }
  p_Var11 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      local_50[0] = (FileMetaData *)p_Var11[1]._M_parent;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)(this->levels_ + (int)p_Var11[1]._M_color),(unsigned_long *)local_50);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  ppVar15 = (edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((edit->new_files_).
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar15) {
    lVar14 = 0x48;
    uVar13 = 0;
    do {
      iVar3 = *(int *)((long)ppVar15 + lVar14 + -0x48);
      pFVar12 = (FileMetaData *)operator_new(0x58);
      p_Var2 = (_Rb_tree_color *)((long)ppVar15 + lVar14 + -0x40);
      _Var6 = p_Var2[1];
      _Var7 = p_Var2[2];
      _Var8 = p_Var2[3];
      pFVar12->refs = *p_Var2;
      pFVar12->allowed_seeks = _Var6;
      *(_Rb_tree_color *)&pFVar12->number = _Var7;
      *(_Rb_tree_color *)((long)&pFVar12->number + 4) = _Var8;
      pFVar12->file_size = (uint64_t)*(_Base_ptr *)((long)ppVar15 + lVar14 + -0x30);
      (pFVar12->smallest).rep_._M_dataplus._M_p = (pointer)&(pFVar12->smallest).rep_.field_2;
      lVar4 = *(long *)((long)ppVar15 + lVar14 + -0x28);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar12->smallest,lVar4,
                 *(long *)((long)ppVar15 + lVar14 + -0x20) + lVar4);
      (pFVar12->largest).rep_._M_dataplus._M_p = (pointer)&(pFVar12->largest).rep_.field_2;
      lVar4 = *(long *)((long)ppVar15 + lVar14 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar12->largest,lVar4,*(long *)((long)&ppVar15->first + lVar14) + lVar4
                );
      pFVar12->refs = _S_black;
      iVar9 = (int)((ulong)pFVar12->file_size >> 0xe);
      if (iVar9 < 0x65) {
        iVar9 = 100;
      }
      pFVar12->allowed_seeks = iVar9;
      local_50[0] = pFVar12;
      pVar16 = std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)(this->levels_ + iVar3),&pFVar12->number);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)(this->levels_ + iVar3),(_Base_ptr)pVar16.first._M_node,
                     (_Base_ptr)pVar16.second._M_node);
      std::
      _Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
      ::_M_insert_unique<leveldb::FileMetaData*const&>
                ((_Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
                  *)this->levels_[iVar3].added_files,local_50);
      uVar13 = uVar13 + 1;
      ppVar15 = (edit->new_files_).
                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x60;
    } while (uVar13 < (ulong)(((long)(edit->new_files_).
                                     super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar15 >> 5
                              ) * -0x5555555555555555));
  }
  return;
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }